

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hash.c
# Opt level: O1

err_t beltHash(octet *hash,void *src,size_t count)

{
  bool_t bVar1;
  size_t sVar2;
  undefined8 *state;
  octet *src_00;
  err_t eVar3;
  belt_hash_st *st;
  
  bVar1 = memIsValid(src,count);
  eVar3 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = memIsValid(hash,0x20);
    if (bVar1 != 0) {
      eVar3 = 0;
      sVar2 = beltCompr_deep();
      state = (undefined8 *)blobCreate(sVar2 + 0x98);
      if (state == (undefined8 *)0x0) {
        eVar3 = 0x6e;
      }
      else {
        state[2] = 0;
        state[3] = 0;
        *state = 0;
        state[1] = 0;
        src_00 = beltH();
        u32From((u32 *)(state + 6),src_00,0x20);
        state[0x12] = 0;
        beltHashStepH(src,count,state);
        beltHashStepG_internal(state);
        u32To(hash,0x20,(u32 *)(state + 10));
        blobClose(state);
      }
    }
  }
  return eVar3;
}

Assistant:

err_t beltHash(octet hash[32], const void* src, size_t count)
{
	void* state;
	// проверить входные данные
	if (!memIsValid(src, count) || !memIsValid(hash, 32))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltHash_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// вычислить хэш-значение
	beltHashStart(state);
	beltHashStepH(src, count, state);
	beltHashStepG(hash, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}